

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::ChromeProcessDescriptor::ParseFromArray
          (ChromeProcessDescriptor *this,void *raw,size_t size)

{
  byte bVar1;
  ulong uVar2;
  undefined1 uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong *puVar7;
  ulong *puVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong *puVar13;
  ulong *puVar14;
  uint uVar15;
  ulong *in_R11;
  ulong *puVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dst;
  ulong uVar17;
  string *psVar18;
  ulong *puVar19;
  bool bVar20;
  ulong *local_68;
  Field local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  string *local_48;
  ulong *local_40;
  ChromeProcessDescriptor *local_38;
  
  dst = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar16 = (ulong *)(size + (long)raw);
  do {
    lVar6 = 7;
    if (raw < puVar16) {
      uVar11 = (ulong)(char)(byte)*raw;
      puVar8 = (ulong *)((long)raw + 1);
      if ((long)uVar11 < 0) {
        bVar1 = (byte)*raw;
        uVar5 = (ulong)(bVar1 & 0x7f);
        bVar9 = false;
        puVar13 = puVar8;
        for (; (uVar11 = uVar5, puVar7 = puVar13, (char)bVar1 < '\0' &&
               (bVar20 = 0x38 < lVar6 - 7U, bVar9 = bVar20 || puVar16 <= puVar13, uVar11 = 0,
               puVar7 = puVar8, !bVar20 && puVar16 > puVar13)); lVar6 = lVar6 + 7) {
          bVar1 = (byte)*puVar13;
          in_R11 = (ulong *)((ulong)(bVar1 & 0x7f) << ((byte)lVar6 & 0x3f));
          puVar13 = (ulong *)((long)puVar13 + 1);
          uVar5 = uVar5 | (ulong)in_R11;
        }
        puVar8 = puVar7;
        if (bVar9) {
          puVar8 = (ulong *)raw;
          uVar11 = 0;
        }
        if (puVar8 == (ulong *)raw) goto LAB_00257333;
      }
      uVar4 = (uint)(uVar11 >> 3);
      if ((uVar4 == 0) || (puVar16 <= puVar8)) {
switchD_002570aa_caseD_3:
        local_60.int_value_ = 0;
        bVar9 = false;
        uVar11 = 0;
        goto LAB_002572a3;
      }
      switch((uint)uVar11 & 7) {
      case 0:
        uVar17 = 0;
        bVar9 = puVar8 >= puVar16;
        if (puVar8 < puVar16) {
          in_R11 = (ulong *)((long)puVar8 + 1);
          uVar5 = (ulong)((byte)*puVar8 & 0x7f);
          uVar10 = uVar5;
          uVar15 = 0;
          if ((char)(byte)*puVar8 < '\0') {
            uVar10 = 0;
            uVar15 = 0;
            lVar6 = 7;
            puVar13 = in_R11;
            do {
              bVar20 = 0x38 < lVar6 - 7U;
              bVar9 = bVar20 || puVar16 <= puVar13;
              if (bVar20 || puVar16 <= puVar13) goto LAB_00257236;
              uVar2 = *puVar13;
              puVar13 = (ulong *)((long)puVar13 + 1);
              uVar5 = uVar5 | (ulong)((byte)uVar2 & 0x7f) << ((byte)lVar6 & 0x3f);
              lVar6 = lVar6 + 7;
            } while ((char)(byte)uVar2 < '\0');
            uVar10 = uVar5 & 0xffffffff;
            in_R11 = puVar13;
            uVar15 = (uint)(uVar5 >> 0x20);
          }
        }
        else {
          uVar10 = 0;
          uVar15 = 0;
        }
LAB_00257236:
        uVar5 = (ulong)uVar15;
        if (bVar9) {
          in_R11 = puVar8;
          uVar5 = uVar17;
          uVar10 = uVar17;
        }
        local_68 = puVar8;
        local_40 = (ulong *)raw;
        if (in_R11 != puVar8) goto LAB_0025725e;
        bVar9 = false;
        goto LAB_0025722f;
      case 1:
        in_R11 = puVar8 + 1;
        if (puVar16 < in_R11) {
LAB_00257228:
          bVar9 = false;
          goto LAB_0025722f;
        }
        uVar10 = *puVar8;
        uVar5 = uVar10 >> 0x20;
        break;
      case 2:
        bVar9 = puVar8 >= puVar16;
        psVar18 = local_48;
        if (puVar8 < puVar16) {
          puVar13 = (ulong *)((long)puVar8 + 1);
          uVar5 = (ulong)((byte)*puVar8 & 0x7f);
          in_R11 = puVar13;
          psVar18 = (string *)uVar5;
          if ((char)(byte)*puVar8 < '\0') {
            lVar6 = 7;
            puVar7 = puVar13;
            do {
              bVar9 = 0x38 < lVar6 - 7U || puVar16 <= puVar7;
              in_R11 = puVar13;
              psVar18 = local_48;
              if (bVar9) break;
              uVar10 = *puVar7;
              puVar7 = (ulong *)((long)puVar7 + 1);
              uVar5 = uVar5 | (ulong)((byte)uVar10 & 0x7f) << ((byte)lVar6 & 0x3f);
              lVar6 = lVar6 + 7;
              in_R11 = puVar7;
              psVar18 = (string *)uVar5;
            } while ((char)(byte)uVar10 < '\0');
          }
        }
        local_48 = psVar18;
        if (bVar9) {
          in_R11 = puVar8;
          local_48 = (string *)0;
        }
        if ((in_R11 == puVar8) || ((ulong)((long)puVar16 - (long)in_R11) < local_48)) {
          uVar5 = 0;
          uVar10 = 0;
          bVar9 = false;
          uVar17 = 0;
        }
        else {
          uVar5 = (ulong)in_R11 >> 0x20;
          uVar10 = (ulong)in_R11 & 0xffffffff;
          in_R11 = (ulong *)((long)in_R11 + (long)local_48);
          bVar9 = true;
          uVar17 = (ulong)local_48;
        }
        local_68 = puVar8;
        if (!bVar9) goto LAB_00257228;
        goto LAB_0025725e;
      default:
        goto switchD_002570aa_caseD_3;
      case 5:
        in_R11 = (ulong *)((long)puVar8 + 4);
        uVar5 = 0;
        if (puVar16 < in_R11) goto LAB_00257333;
        uVar10 = (ulong)(uint)*puVar8;
      }
      uVar17 = 0;
LAB_0025725e:
      bVar9 = true;
      raw = in_R11;
      if (uVar4 < 0x10000) {
        bVar9 = 0xfffffff < uVar17;
        if (bVar9) {
          local_60.int_value_ = 0;
          uVar11 = 0;
        }
        else {
          local_60.int_value_ = uVar10 & 0xffffffff | uVar5 << 0x20;
          uVar11 = uVar17 | (uVar11 >> 3) << 0x20 | (ulong)((uint)uVar11 & 7) << 0x30;
        }
      }
      else {
LAB_0025722f:
        local_60.int_value_ = 0;
        uVar11 = 0;
      }
    }
    else {
LAB_00257333:
      local_60.int_value_ = 0;
      uVar11 = 0;
      bVar9 = false;
    }
LAB_002572a3:
    if (!bVar9) {
      local_60.size_ = (uint32_t)uVar11;
      local_60.type_ = (uint8_t)(uVar11 >> 0x30);
      local_60.id_ = (uint16_t)(uVar11 >> 0x20);
      if (local_60.id_ != 0) {
        local_48 = &this->host_app_package_name_;
        local_50 = dst;
        local_38 = this;
        do {
          if ((ushort)(uVar11 >> 0x20) < 6) {
            (this->_has_field_).super__Base_bitset<1UL>._M_w =
                 (this->_has_field_).super__Base_bitset<1UL>._M_w |
                 1L << ((byte)(uVar11 >> 0x20) & 0x3f);
          }
          uVar4 = ((uint)(uVar11 >> 0x20) & 0xffff) - 1;
          if (uVar4 < 5) {
            uVar3 = (*(code *)(&DAT_0034e96c + *(int *)(&DAT_0034e96c + (ulong)uVar4 * 4)))();
            return (bool)uVar3;
          }
          protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_60,dst);
          do {
            if (puVar16 <= raw) {
LAB_0025774b:
              local_60.int_value_ = 0;
              uVar11 = 0;
              bVar9 = false;
              goto LAB_00257756;
            }
            uVar11 = (ulong)(char)(byte)*raw;
            puVar8 = (ulong *)((long)raw + 1);
            if ((long)uVar11 < 0) {
              uVar5 = (ulong)((byte)*raw & 0x7f);
              bVar9 = false;
              uVar11 = uVar5;
              puVar13 = puVar8;
              if ((char)(byte)*raw < '\0') {
                lVar6 = 7;
                puVar7 = puVar8;
                do {
                  bVar9 = 0x38 < lVar6 - 7U || puVar16 <= puVar7;
                  uVar11 = 0;
                  puVar13 = puVar8;
                  if (bVar9) break;
                  uVar10 = *puVar7;
                  puVar13 = (ulong *)((long)puVar7 + 1);
                  uVar5 = uVar5 | (ulong)((byte)uVar10 & 0x7f) << ((byte)lVar6 & 0x3f);
                  lVar6 = lVar6 + 7;
                  uVar11 = uVar5;
                  puVar7 = puVar13;
                } while ((char)(byte)uVar10 < '\0');
              }
              puVar8 = puVar13;
              if (bVar9) {
                puVar8 = (ulong *)raw;
                uVar11 = 0;
              }
              if (puVar8 == (ulong *)raw) goto LAB_0025774b;
            }
            bVar9 = false;
            uVar4 = (uint)(uVar11 >> 3);
            if ((uVar4 == 0) || (puVar16 <= puVar8)) {
switchD_002574a3_caseD_3:
              local_60.int_value_ = 0;
              uVar11 = 0;
              goto LAB_00257756;
            }
            bVar9 = false;
            puVar13 = (ulong *)raw;
            switch((uint)uVar11 & 7) {
            case 0:
              local_60.int_value_ = 0;
              bVar9 = puVar8 >= puVar16;
              if (puVar8 < puVar16) {
                puVar7 = (ulong *)((long)puVar8 + 1);
                uVar15 = (byte)*puVar8 & 0x7f;
                uVar5 = (ulong)uVar15;
                puVar19 = (ulong *)(ulong)uVar15;
                puVar13 = puVar7;
                uVar15 = 0;
                if ((char)(byte)*puVar8 < '\0') {
                  puVar19 = (ulong *)0x0;
                  lVar6 = 7;
                  puVar14 = puVar7;
                  do {
                    bVar20 = 0x38 < lVar6 - 7U;
                    bVar9 = bVar20 || puVar16 <= puVar14;
                    puVar13 = puVar7;
                    uVar15 = 0;
                    if (bVar20 || puVar16 <= puVar14) break;
                    bVar1 = (byte)*puVar14;
                    puVar14 = (ulong *)((long)puVar14 + 1);
                    uVar5 = uVar5 | (ulong)(bVar1 & 0x7f) << ((byte)lVar6 & 0x3f);
                    lVar6 = lVar6 + 7;
                    if (-1 < (char)bVar1) {
                      puVar19 = (ulong *)(uVar5 & 0xffffffff);
                    }
                    puVar13 = puVar14;
                    uVar15 = (uint)(uVar5 >> 0x20);
                  } while (-1 >= (char)bVar1);
                }
              }
              else {
                puVar19 = (ulong *)0x0;
                uVar15 = 0;
              }
              if (bVar9) {
                puVar19 = (ulong *)local_60.int_value_;
              }
              puVar7 = (ulong *)(ulong)uVar15;
              if (bVar9) {
                puVar13 = puVar8;
                puVar7 = (ulong *)local_60.int_value_;
              }
              this = local_38;
              puVar14 = (ulong *)local_60.int_value_;
              dst = local_50;
              local_40 = (ulong *)raw;
              if (puVar13 == puVar8) {
                uVar11 = 0;
                bVar9 = false;
              }
              else {
LAB_00257686:
                raw = puVar13;
                bVar9 = true;
                if ((0xffff < uVar4) || ((ulong *)0xfffffff < puVar14))
                goto switchD_002574a3_caseD_3;
                local_60.int_value_ = (ulong)puVar19 & 0xffffffff | (long)puVar7 << 0x20;
                uVar11 = (ulong)puVar14 | (uVar11 >> 3) << 0x20 | (uVar11 & 7) << 0x30;
                bVar9 = false;
              }
              break;
            case 1:
              puVar13 = puVar8 + 1;
              if (puVar13 <= puVar16) {
                puVar19 = (ulong *)*puVar8;
                puVar7 = (ulong *)((ulong)puVar19 >> 0x20);
LAB_00257505:
                puVar14 = (ulong *)0x0;
                goto LAB_00257686;
              }
              goto LAB_00257437;
            case 2:
              bVar9 = puVar8 >= puVar16;
              puVar7 = local_68;
              if (puVar8 < puVar16) {
                puVar19 = (ulong *)((long)puVar8 + 1);
                puVar14 = (ulong *)(ulong)((byte)*puVar8 & 0x7f);
                puVar13 = puVar19;
                puVar7 = puVar14;
                if ((char)(byte)*puVar8 < '\0') {
                  lVar6 = 7;
                  puVar12 = puVar19;
                  do {
                    bVar9 = 0x38 < lVar6 - 7U || puVar16 <= puVar12;
                    puVar13 = puVar19;
                    puVar7 = local_68;
                    if (bVar9) break;
                    uVar5 = *puVar12;
                    puVar12 = (ulong *)((long)puVar12 + 1);
                    puVar14 = (ulong *)((ulong)puVar14 |
                                       (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar6 & 0x3f));
                    lVar6 = lVar6 + 7;
                    puVar13 = puVar12;
                    puVar7 = puVar14;
                  } while ((char)(byte)uVar5 < '\0');
                }
              }
              local_68 = puVar7;
              if (bVar9) {
                puVar13 = puVar8;
                local_68 = (ulong *)0x0;
              }
              if ((puVar13 == puVar8) || ((ulong *)((long)puVar16 - (long)puVar13) < local_68)) {
                puVar19 = (ulong *)0x0;
                puVar7 = (ulong *)0x0;
                bVar9 = false;
                puVar14 = (ulong *)0x0;
              }
              else {
                puVar7 = (ulong *)((ulong)puVar13 >> 0x20);
                puVar19 = (ulong *)((ulong)puVar13 & 0xffffffff);
                puVar13 = (ulong *)((long)puVar13 + (long)local_68);
                bVar9 = true;
                puVar14 = local_68;
              }
              if (bVar9) goto LAB_00257686;
              local_60.int_value_ = 0;
              uVar11 = 0;
              bVar9 = false;
              break;
            default:
              goto switchD_002574a3_caseD_3;
            case 5:
              puVar13 = (ulong *)((long)puVar8 + 4);
              puVar7 = (ulong *)0x0;
              if (puVar13 <= puVar16) {
                puVar19 = (ulong *)(ulong)(uint)*puVar8;
                goto LAB_00257505;
              }
LAB_00257437:
              uVar11 = 0;
              local_60.int_value_ = 0;
              bVar9 = false;
            }
LAB_00257756:
          } while (bVar9);
          local_60.size_ = (uint32_t)uVar11;
          local_60.type_ = (uint8_t)(uVar11 >> 0x30);
          local_60.id_ = (uint16_t)(uVar11 >> 0x20);
        } while (local_60.id_ != 0);
      }
      return puVar16 == (ulong *)raw;
    }
  } while( true );
}

Assistant:

bool ChromeProcessDescriptor::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* process_type */:
        field.get(&process_type_);
        break;
      case 2 /* process_priority */:
        field.get(&process_priority_);
        break;
      case 3 /* legacy_sort_index */:
        field.get(&legacy_sort_index_);
        break;
      case 4 /* host_app_package_name */:
        field.get(&host_app_package_name_);
        break;
      case 5 /* crash_trace_id */:
        field.get(&crash_trace_id_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}